

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DiskTable.cpp
# Opt level: O0

bool __thiscall DiskTableNode::mightIn(DiskTableNode *this,longlong key)

{
  SSTableHeader *pSVar1;
  Filter *this_00;
  bool local_29;
  Filter *f;
  SSTableHeader *h;
  longlong key_local;
  DiskTableNode *this_local;
  
  h = (SSTableHeader *)key;
  key_local = (longlong)this;
  pSVar1 = getHeader(this);
  this_00 = getFilter(this);
  local_29 = false;
  if ((pSVar1->key_min <= (long)h) && (local_29 = false, (long)h <= pSVar1->key_max)) {
    local_29 = BloomFilter<long_long>::find(this_00,(longlong *)&h);
  }
  return local_29;
}

Assistant:

bool DiskTableNode::mightIn(long long key) {
    auto *h = getHeader();
    auto *f = getFilter();
    return key >= h->key_min && key <= h->key_max && f->find(key);
}